

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall amrex::AmrLevel::constructAreaNotToTag(AmrLevel *this)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  pointer pIVar4;
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var5;
  ulong uVar6;
  Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *pVVar7;
  long lVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  Amr *pAVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  uint uVar17;
  int iVar18;
  int iVar19;
  BoxArray tagba;
  BoxArray bxa;
  BoxArray local_120;
  Box local_b8;
  BoxArray local_98;
  
  iVar16 = this->level;
  if ((iVar16 != 0) &&
     (pAVar12 = this->parent,
     (pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_coarse_grids == true)) {
    iVar15 = (pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_upto_level;
    if (iVar15 <= iVar16) {
      if (iVar15 == iVar16) {
        pVVar7 = Amr::getInitialBA(pAVar12);
        BoxArray::minimalBox
                  (&local_b8,
                   (pVVar7->super_vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>).
                   super__Vector_base<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>._M_impl.
                   super__Vector_impl_data._M_start + (long)this->level + -1);
        pAVar12 = this->parent;
        iVar16 = this->level;
        pIVar4 = (pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.blocking_factor.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar15 = pIVar4[iVar16].vect[0];
        uVar1 = *(undefined8 *)(pIVar4[iVar16].vect + 1);
        iVar13 = (int)((ulong)uVar1 >> 0x20);
        iVar14 = (int)uVar1;
        local_b8.smallend.vect[0] = iVar15 + local_b8.smallend.vect[0];
        local_b8.smallend.vect[1] = iVar14 + local_b8.smallend.vect[1];
        local_b8.smallend.vect[2] = iVar13 + local_b8.smallend.vect[2];
        local_b8.bigend.vect[0] = local_b8.bigend.vect[0] - iVar15;
        local_b8.bigend.vect[1] = local_b8.bigend.vect[1] - iVar14;
        local_b8.bigend.vect[2] = local_b8.bigend.vect[2] - iVar13;
        *(ulong *)(this->m_AreaToTag).bigend.vect =
             CONCAT44(local_b8.bigend.vect[1],local_b8.bigend.vect[0]);
        *(ulong *)((this->m_AreaToTag).bigend.vect + 2) =
             CONCAT44(local_b8.btype.itype,local_b8.bigend.vect[2]);
        *(ulong *)(this->m_AreaToTag).smallend.vect =
             CONCAT44(local_b8.smallend.vect[1],local_b8.smallend.vect[0]);
        *(ulong *)((this->m_AreaToTag).smallend.vect + 2) =
             CONCAT44(local_b8.bigend.vect[0],local_b8.smallend.vect[2]);
        boxComplement(&local_120,
                      &(pAVar12->super_AmrCore).super_AmrMesh.geom.
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl
                       .super__Vector_impl_data._M_start[iVar16].domain,&this->m_AreaToTag);
        BoxArray::operator=(&this->m_AreaNotToTag,&local_120);
        BoxArray::BoxArray(&local_98,
                           &(this->parent->super_AmrCore).super_AmrMesh.geom.
                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            _M_impl.super__Vector_impl_data._M_start[this->level].domain);
        BoxArray::~BoxArray(&local_98);
        BoxArray::~BoxArray(&local_120);
        pAVar12 = this->parent;
        iVar15 = (pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.use_fixed_upto_level;
        iVar16 = this->level;
      }
      if (iVar15 < iVar16) {
        lVar8 = (long)iVar16;
        pIVar4 = (pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.ref_ratio.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        _Var5.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
        super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
        super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
             (pAVar12->amr_level).
             super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             .
             super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[lVar8 + -1]._M_t.
             super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
        iVar16 = *(int *)((long)_Var5.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                         0x1f0);
        iVar15 = *(int *)((long)_Var5.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl + 500)
        ;
        iVar14 = *(int *)((long)_Var5.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                         0x1f8);
        iVar13 = *(int *)((long)_Var5.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                         0x1fc);
        iVar11 = *(int *)((long)_Var5.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                         0x200);
        iVar10 = *(int *)((long)_Var5.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                         0x204);
        uVar2 = *(uint *)((long)_Var5.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                         0x208);
        uVar6 = *(ulong *)pIVar4[lVar8 + -1].vect;
        iVar3 = pIVar4[lVar8 + -1].vect[2];
        iVar18 = (int)uVar6;
        if ((iVar3 != 1 || iVar18 != 1) || uVar6 >> 0x20 != 1) {
          iVar16 = iVar16 * iVar18;
          iVar19 = (int)(uVar6 >> 0x20);
          iVar15 = iVar15 * iVar19;
          iVar14 = iVar14 * iVar3;
          uVar17 = (uint)((uVar2 & 2) == 0);
          uVar9 = (uint)((uVar2 & 4) == 0);
          iVar13 = (iVar13 + (~uVar2 & 1)) * iVar18 - (~uVar2 & 1);
          iVar11 = (iVar11 + uVar17) * iVar19 - uVar17;
          iVar10 = (iVar10 + uVar9) * iVar3 - uVar9;
        }
        pIVar4 = (pAVar12->super_AmrCore).super_AmrMesh.super_AmrInfo.blocking_factor.
                 super_vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>.
                 super__Vector_base<amrex::IntVect,_std::allocator<amrex::IntVect>_>._M_impl.
                 super__Vector_impl_data._M_start;
        iVar3 = pIVar4[lVar8].vect[0];
        iVar18 = pIVar4[lVar8].vect[1];
        iVar19 = pIVar4[lVar8].vect[2];
        (this->m_AreaToTag).smallend.vect[0] = iVar16 + iVar3;
        (this->m_AreaToTag).smallend.vect[1] = iVar15 + iVar18;
        (this->m_AreaToTag).smallend.vect[2] = iVar14 + iVar19;
        (this->m_AreaToTag).bigend.vect[0] = iVar13 - iVar3;
        (this->m_AreaToTag).bigend.vect[1] = iVar11 - iVar18;
        (this->m_AreaToTag).bigend.vect[2] = iVar10 - iVar19;
        (this->m_AreaToTag).btype.itype = uVar2;
        boxComplement(&local_120,
                      &(pAVar12->super_AmrCore).super_AmrMesh.geom.
                       super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                       super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>._M_impl
                       .super__Vector_impl_data._M_start[lVar8].domain,&this->m_AreaToTag);
        BoxArray::operator=(&this->m_AreaNotToTag,&local_120);
        BoxArray::~BoxArray(&local_120);
      }
    }
  }
  return;
}

Assistant:

void AmrLevel::constructAreaNotToTag ()
{
    if (level == 0 || !parent->useFixedCoarseGrids() || parent->useFixedUpToLevel()>level)
        return;

    // We are restricting the tagging on the finest fixed level
    if (parent->useFixedUpToLevel()==level)
    {
        // We use the next coarser level shrunk by one blockingfactor
        //    as the region in which we allow tagging.
        // Why level-1? Because we always use the full domain at level 0
        //    and therefore level 0 in initialba is level 1 in the AMR hierarchy, etc.
        const Vector<BoxArray>& initialba = parent->getInitialBA();
        Box tagarea(initialba[level-1].minimalBox());
        tagarea.grow(-parent->blockingFactor(level));
        m_AreaToTag = tagarea;

        // We disallow tagging in the remaining part of the domain.
        BoxArray tagba = amrex::boxComplement(parent->Geom(level).Domain(),m_AreaToTag);
        m_AreaNotToTag = tagba;

        BoxArray bxa(parent->Geom(level).Domain());
        BL_ASSERT(bxa.contains(m_AreaNotToTag));
    }

    if (parent->useFixedUpToLevel()<level)
    {
        Box tagarea = parent->getLevel(level-1).getAreaToTag();
        tagarea.refine(parent->refRatio(level-1));
        tagarea.grow(-parent->blockingFactor(level));
        m_AreaToTag = tagarea;
        BoxArray tagba = amrex::boxComplement(parent->Geom(level).Domain(),m_AreaToTag);
        m_AreaNotToTag = tagba;
    }
}